

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O0

int json_serialize_string(char *string,size_t len,char *buf)

{
  int local_34;
  int written_total;
  int written;
  char c;
  size_t i;
  char *buf_local;
  size_t len_local;
  char *string_local;
  
  i = (size_t)buf;
  if (buf != (char *)0x0) {
    memcpy(buf,"\"",1);
    buf[1] = '\0';
    i = (size_t)(buf + 1);
  }
  local_34 = 1;
  for (_written = 0; _written < len; _written = _written + 1) {
    switch(string[_written]) {
    case '\0':
      if (i != 0) {
        memcpy((void *)i,"\\u0000",6);
        *(undefined1 *)(i + 6) = 0;
        i = i + 6;
      }
      local_34 = local_34 + 6;
      break;
    case '\x01':
      if (i != 0) {
        memcpy((void *)i,"\\u0001",6);
        *(undefined1 *)(i + 6) = 0;
        i = i + 6;
      }
      local_34 = local_34 + 6;
      break;
    case '\x02':
      if (i != 0) {
        memcpy((void *)i,"\\u0002",6);
        *(undefined1 *)(i + 6) = 0;
        i = i + 6;
      }
      local_34 = local_34 + 6;
      break;
    case '\x03':
      if (i != 0) {
        memcpy((void *)i,"\\u0003",6);
        *(undefined1 *)(i + 6) = 0;
        i = i + 6;
      }
      local_34 = local_34 + 6;
      break;
    case '\x04':
      if (i != 0) {
        memcpy((void *)i,"\\u0004",6);
        *(undefined1 *)(i + 6) = 0;
        i = i + 6;
      }
      local_34 = local_34 + 6;
      break;
    case '\x05':
      if (i != 0) {
        memcpy((void *)i,"\\u0005",6);
        *(undefined1 *)(i + 6) = 0;
        i = i + 6;
      }
      local_34 = local_34 + 6;
      break;
    case '\x06':
      if (i != 0) {
        memcpy((void *)i,"\\u0006",6);
        *(undefined1 *)(i + 6) = 0;
        i = i + 6;
      }
      local_34 = local_34 + 6;
      break;
    case '\a':
      if (i != 0) {
        memcpy((void *)i,"\\u0007",6);
        *(undefined1 *)(i + 6) = 0;
        i = i + 6;
      }
      local_34 = local_34 + 6;
      break;
    case '\b':
      if (i != 0) {
        memcpy((void *)i,"\\b",2);
        *(undefined1 *)(i + 2) = 0;
        i = i + 2;
      }
      local_34 = local_34 + 2;
      break;
    case '\t':
      if (i != 0) {
        memcpy((void *)i,"\\t",2);
        *(undefined1 *)(i + 2) = 0;
        i = i + 2;
      }
      local_34 = local_34 + 2;
      break;
    case '\n':
      if (i != 0) {
        memcpy((void *)i,"\\n",2);
        *(undefined1 *)(i + 2) = 0;
        i = i + 2;
      }
      local_34 = local_34 + 2;
      break;
    case '\v':
      if (i != 0) {
        memcpy((void *)i,"\\u000b",6);
        *(undefined1 *)(i + 6) = 0;
        i = i + 6;
      }
      local_34 = local_34 + 6;
      break;
    case '\f':
      if (i != 0) {
        memcpy((void *)i,"\\f",2);
        *(undefined1 *)(i + 2) = 0;
        i = i + 2;
      }
      local_34 = local_34 + 2;
      break;
    case '\r':
      if (i != 0) {
        memcpy((void *)i,"\\r",2);
        *(undefined1 *)(i + 2) = 0;
        i = i + 2;
      }
      local_34 = local_34 + 2;
      break;
    case '\x0e':
      if (i != 0) {
        memcpy((void *)i,"\\u000e",6);
        *(undefined1 *)(i + 6) = 0;
        i = i + 6;
      }
      local_34 = local_34 + 6;
      break;
    case '\x0f':
      if (i != 0) {
        memcpy((void *)i,"\\u000f",6);
        *(undefined1 *)(i + 6) = 0;
        i = i + 6;
      }
      local_34 = local_34 + 6;
      break;
    case '\x10':
      if (i != 0) {
        memcpy((void *)i,"\\u0010",6);
        *(undefined1 *)(i + 6) = 0;
        i = i + 6;
      }
      local_34 = local_34 + 6;
      break;
    case '\x11':
      if (i != 0) {
        memcpy((void *)i,"\\u0011",6);
        *(undefined1 *)(i + 6) = 0;
        i = i + 6;
      }
      local_34 = local_34 + 6;
      break;
    case '\x12':
      if (i != 0) {
        memcpy((void *)i,"\\u0012",6);
        *(undefined1 *)(i + 6) = 0;
        i = i + 6;
      }
      local_34 = local_34 + 6;
      break;
    case '\x13':
      if (i != 0) {
        memcpy((void *)i,"\\u0013",6);
        *(undefined1 *)(i + 6) = 0;
        i = i + 6;
      }
      local_34 = local_34 + 6;
      break;
    case '\x14':
      if (i != 0) {
        memcpy((void *)i,"\\u0014",6);
        *(undefined1 *)(i + 6) = 0;
        i = i + 6;
      }
      local_34 = local_34 + 6;
      break;
    case '\x15':
      if (i != 0) {
        memcpy((void *)i,"\\u0015",6);
        *(undefined1 *)(i + 6) = 0;
        i = i + 6;
      }
      local_34 = local_34 + 6;
      break;
    case '\x16':
      if (i != 0) {
        memcpy((void *)i,"\\u0016",6);
        *(undefined1 *)(i + 6) = 0;
        i = i + 6;
      }
      local_34 = local_34 + 6;
      break;
    case '\x17':
      if (i != 0) {
        memcpy((void *)i,"\\u0017",6);
        *(undefined1 *)(i + 6) = 0;
        i = i + 6;
      }
      local_34 = local_34 + 6;
      break;
    case '\x18':
      if (i != 0) {
        memcpy((void *)i,"\\u0018",6);
        *(undefined1 *)(i + 6) = 0;
        i = i + 6;
      }
      local_34 = local_34 + 6;
      break;
    case '\x19':
      if (i != 0) {
        memcpy((void *)i,"\\u0019",6);
        *(undefined1 *)(i + 6) = 0;
        i = i + 6;
      }
      local_34 = local_34 + 6;
      break;
    case '\x1a':
      if (i != 0) {
        memcpy((void *)i,"\\u001a",6);
        *(undefined1 *)(i + 6) = 0;
        i = i + 6;
      }
      local_34 = local_34 + 6;
      break;
    case '\x1b':
      if (i != 0) {
        memcpy((void *)i,"\\u001b",6);
        *(undefined1 *)(i + 6) = 0;
        i = i + 6;
      }
      local_34 = local_34 + 6;
      break;
    case '\x1c':
      if (i != 0) {
        memcpy((void *)i,"\\u001c",6);
        *(undefined1 *)(i + 6) = 0;
        i = i + 6;
      }
      local_34 = local_34 + 6;
      break;
    case '\x1d':
      if (i != 0) {
        memcpy((void *)i,"\\u001d",6);
        *(undefined1 *)(i + 6) = 0;
        i = i + 6;
      }
      local_34 = local_34 + 6;
      break;
    case '\x1e':
      if (i != 0) {
        memcpy((void *)i,"\\u001e",6);
        *(undefined1 *)(i + 6) = 0;
        i = i + 6;
      }
      local_34 = local_34 + 6;
      break;
    case '\x1f':
      if (i != 0) {
        memcpy((void *)i,"\\u001f",6);
        *(undefined1 *)(i + 6) = 0;
        i = i + 6;
      }
      local_34 = local_34 + 6;
      break;
    default:
      if (i != 0) {
        *(char *)i = string[_written];
        i = i + 1;
      }
      local_34 = local_34 + 1;
      break;
    case '\"':
      if (i != 0) {
        memcpy((void *)i,"\\\"",2);
        *(undefined1 *)(i + 2) = 0;
        i = i + 2;
      }
      local_34 = local_34 + 2;
      break;
    case '/':
      if (parson_escape_slashes == 0) {
        if (i != 0) {
          memcpy((void *)i,"/",1);
          *(undefined1 *)(i + 1) = 0;
          i = i + 1;
        }
        local_34 = local_34 + 1;
      }
      else {
        if (i != 0) {
          memcpy((void *)i,"\\/",2);
          *(undefined1 *)(i + 2) = 0;
          i = i + 2;
        }
        local_34 = local_34 + 2;
      }
      break;
    case '\\':
      if (i != 0) {
        memcpy((void *)i,"\\\\",2);
        *(undefined1 *)(i + 2) = 0;
        i = i + 2;
      }
      local_34 = local_34 + 2;
    }
  }
  if (i != 0) {
    memcpy((void *)i,"\"",1);
    *(undefined1 *)(i + 1) = 0;
  }
  return local_34 + 1;
}

Assistant:

static int json_serialize_string(const char *string, size_t len, char *buf) {
    size_t i = 0;
    char c = '\0';
    int written = -1, written_total = 0;
    APPEND_STRING("\"");
    for (i = 0; i < len; i++) {
        c = string[i];
        switch (c) {
            case '\"': APPEND_STRING("\\\""); break;
            case '\\': APPEND_STRING("\\\\"); break;
            case '\b': APPEND_STRING("\\b"); break;
            case '\f': APPEND_STRING("\\f"); break;
            case '\n': APPEND_STRING("\\n"); break;
            case '\r': APPEND_STRING("\\r"); break;
            case '\t': APPEND_STRING("\\t"); break;
            case '\x00': APPEND_STRING("\\u0000"); break;
            case '\x01': APPEND_STRING("\\u0001"); break;
            case '\x02': APPEND_STRING("\\u0002"); break;
            case '\x03': APPEND_STRING("\\u0003"); break;
            case '\x04': APPEND_STRING("\\u0004"); break;
            case '\x05': APPEND_STRING("\\u0005"); break;
            case '\x06': APPEND_STRING("\\u0006"); break;
            case '\x07': APPEND_STRING("\\u0007"); break;
            /* '\x08' duplicate: '\b' */
            /* '\x09' duplicate: '\t' */
            /* '\x0a' duplicate: '\n' */
            case '\x0b': APPEND_STRING("\\u000b"); break;
            /* '\x0c' duplicate: '\f' */
            /* '\x0d' duplicate: '\r' */
            case '\x0e': APPEND_STRING("\\u000e"); break;
            case '\x0f': APPEND_STRING("\\u000f"); break;
            case '\x10': APPEND_STRING("\\u0010"); break;
            case '\x11': APPEND_STRING("\\u0011"); break;
            case '\x12': APPEND_STRING("\\u0012"); break;
            case '\x13': APPEND_STRING("\\u0013"); break;
            case '\x14': APPEND_STRING("\\u0014"); break;
            case '\x15': APPEND_STRING("\\u0015"); break;
            case '\x16': APPEND_STRING("\\u0016"); break;
            case '\x17': APPEND_STRING("\\u0017"); break;
            case '\x18': APPEND_STRING("\\u0018"); break;
            case '\x19': APPEND_STRING("\\u0019"); break;
            case '\x1a': APPEND_STRING("\\u001a"); break;
            case '\x1b': APPEND_STRING("\\u001b"); break;
            case '\x1c': APPEND_STRING("\\u001c"); break;
            case '\x1d': APPEND_STRING("\\u001d"); break;
            case '\x1e': APPEND_STRING("\\u001e"); break;
            case '\x1f': APPEND_STRING("\\u001f"); break;
            case '/':
                if (parson_escape_slashes) {
                    APPEND_STRING("\\/");  /* to make json embeddable in xml\/html */
                } else {
                    APPEND_STRING("/");
                }
                break;
            default:
                if (buf != NULL) {
                    buf[0] = c;
                    buf += 1;
                }
                written_total += 1;
                break;
        }
    }
    APPEND_STRING("\"");
    return written_total;
}